

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall
HModel::util_extractCols
          (HModel *this,int firstcol,int lastcol,double *XcolLower,double *XcolUpper,int *nnonz,
          int *XAstart,int *XAindex,double *XAvalue)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  long lVar8;
  long lVar9;
  
  printf("Called model.util_extractCols(firstcol=%d, lastcol=%d)\n");
  std::ostream::flush();
  lVar8 = (long)firstcol;
  piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = piVar4 + lVar8;
  iVar2 = *piVar1;
  pdVar5 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar9 = 0; lVar8 + lVar9 <= (long)lastcol; lVar9 = lVar9 + 1) {
    XcolLower[lVar9] = pdVar5[lVar8 + lVar9];
    XcolUpper[lVar9] = pdVar6[lVar8 + lVar9];
    XAstart[lVar9] = piVar1[lVar9] - iVar2;
  }
  piVar7 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar8 = (long)*piVar1; iVar3 = piVar4[(long)lastcol + 1], lVar8 < iVar3; lVar8 = lVar8 + 1) {
    XAindex[lVar8 - iVar2] = piVar7[lVar8];
    XAvalue[lVar8 - iVar2] = pdVar5[lVar8];
  }
  *nnonz = iVar3 - iVar2;
  return;
}

Assistant:

void HModel::util_extractCols(int firstcol, int lastcol, double* XcolLower, double* XcolUpper,
			  int* nnonz, int* XAstart, int* XAindex, double* XAvalue) {
  assert(firstcol >= 0);
  assert(lastcol < numCol);
  assert(firstcol <= lastcol);
#ifdef JAJH_dev
  printf("Called model.util_extractCols(firstcol=%d, lastcol=%d)\n", firstcol, lastcol);cout << flush;
#endif
  //Determine the number of columns to be extracted
  //int numExtractCols = lastcol-firstcol+1;
  //printf("Extracting %d columns\n", numExtractCols);cout << flush;
  int elOs = Astart[firstcol];
  for (int col = firstcol; col <= lastcol; col++) {
    //    printf("Extracting column %d\n", col);cout << flush;
    XcolLower[col-firstcol] = colLower[col];
    XcolUpper[col-firstcol] = colUpper[col];
    XAstart[col-firstcol] = Astart[col]-elOs;
  }
  for (int el = Astart[firstcol]; el < Astart[lastcol+1]; el++) {
    XAindex[el-elOs] = Aindex[el];
    XAvalue[el-elOs] = Avalue[el];
  }
  *nnonz = Astart[lastcol+1]-elOs;
}